

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::TestCaseInfo::TestCaseInfo
          (TestCaseInfo *this,string *_name,string *_className,string *_description,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *_tags,SourceLineInfo *_lineInfo)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar2 = (_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar2,pcVar2 + _name->_M_string_length);
  (this->className)._M_dataplus._M_p = (pointer)&(this->className).field_2;
  pcVar2 = (_className->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->className,pcVar2,pcVar2 + _className->_M_string_length);
  (this->description)._M_dataplus._M_p = (pointer)&(this->description).field_2;
  pcVar2 = (_description->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->description,pcVar2,pcVar2 + _description->_M_string_length);
  p_Var1 = &(this->tags)._M_t._M_impl.super__Rb_tree_header;
  (this->tags)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->tags)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->tags)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->tags)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->tags)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->lcaseTags)._M_t._M_impl.super__Rb_tree_header;
  (this->lcaseTags)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->lcaseTags)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->lcaseTags)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->lcaseTags)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->lcaseTags)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->tagsAsString)._M_dataplus._M_p = (pointer)&(this->tagsAsString).field_2;
  (this->tagsAsString)._M_string_length = 0;
  (this->tagsAsString).field_2._M_local_buf[0] = '\0';
  (this->lineInfo).file._M_dataplus._M_p = (pointer)&(this->lineInfo).file.field_2;
  pcVar2 = (_lineInfo->file)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->lineInfo,pcVar2,pcVar2 + (_lineInfo->file)._M_string_length);
  (this->lineInfo).line = _lineInfo->line;
  this->properties = None;
  setTags(this,_tags);
  return;
}

Assistant:

TestCaseInfo::TestCaseInfo(std::string const& _name,
		std::string const& _className,
		std::string const& _description,
		std::set<std::string> const& _tags,
		SourceLineInfo const& _lineInfo)
		: name(_name),
		className(_className),
		description(_description),
		lineInfo(_lineInfo),
		properties(None)
	{
		setTags(*this, _tags);
	}